

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ITracker * __thiscall Catch::TestCaseTracking::TrackerContext::startRun(TrackerContext *this)

{
  allocator<char> local_79;
  undefined1 local_78 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  TrackerContext local_40;
  char *local_20;
  undefined8 local_18;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_78 + 0x18),"{root}",&local_79)
  ;
  std::__cxx11::string::string
            ((string *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_78 + 0x18))
  ;
  local_20 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Catch2/catch.hpp"
  ;
  local_18 = 0x3817;
  local_78._16_8_ = 0;
  std::
  make_shared<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,decltype(nullptr)>
            ((NameAndLocation *)local_78,&local_40,(void **)this);
  std::__shared_ptr<Catch::TestCaseTracking::ITracker,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Catch::TestCaseTracking::ITracker,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Catch::TestCaseTracking::SectionTracker,_(__gnu_cxx::_Lock_policy)2> *)
             local_78);
  clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)(local_78 + 0x18));
  this->m_currentTracker = (ITracker *)0x0;
  this->m_runState = Executing;
  return (this->m_rootTracker).
         super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

ITracker& TrackerContext::startRun() {
        m_rootTracker = std::make_shared<SectionTracker>( NameAndLocation( "{root}", CATCH_INTERNAL_LINEINFO ), *this, nullptr );
        m_currentTracker = nullptr;
        m_runState = Executing;
        return *m_rootTracker;
    }